

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment.hpp
# Opt level: O2

void pstore::repo::fragment::
     check_range_is_sorted<pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>>
               (pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                first,pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                      last)

{
  bool bVar1;
  
  bVar1 = std::
          is_sorted<pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>,pstore::repo::fragment::check_range_is_sorted<pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>>(pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>,pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>)::_lambda(pstore::repo::section_creation_dispatcher_const&,pstore::repo::section_creation_dispatcher_const&)_1_>
                    ();
  if (bVar1) {
    return;
  }
  assert_failed("std::is_sorted (first, last, [] (value_type const & a, value_type const & b) { section_kind const akind = a.kind (); section_kind const bkind = b.kind (); using utype = std::underlying_type<section_kind>::type; return static_cast<utype> (akind) < static_cast<utype> (bkind); })"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/fragment.hpp"
                ,0x1c2);
}

Assistant:

void fragment::check_range_is_sorted (Iterator first, Iterator last) {
            (void) first;
            (void) last;
#ifndef NDEBUG
            using value_type = typename std::iterator_traits<Iterator>::value_type;
            PSTORE_ASSERT (
                std::is_sorted (first, last, [] (value_type const & a, value_type const & b) {
                    section_kind const akind = a.kind ();
                    section_kind const bkind = b.kind ();
                    using utype = std::underlying_type<section_kind>::type;
                    return static_cast<utype> (akind) < static_cast<utype> (bkind);
                }));
#endif
        }